

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp
# Opt level: O1

void __thiscall
glcts::TextureBorderClampSamplerParameterIWithWrongPnameTest::initTest
          (TextureBorderClampSamplerParameterIWithWrongPnameTest *this)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  iterator iVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  NotSupportedError *this_01;
  uint local_1c;
  long lVar4;
  
  if ((this->super_TextureBorderClampBase).super_TestCaseBase.m_is_texture_border_clamp_supported !=
      false) {
    iVar2 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    (**(code **)(lVar4 + 0x6f0))(1,&this->m_sampler_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error generating sampler object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
                    ,99);
    (**(code **)(lVar4 + 0xa8))(0,this->m_sampler_id);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error binding sampler object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
                    ,0x67);
    this_00 = &this->m_pnames_list;
    local_1c = 0x813c;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x813c;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x912f;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x912f;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x813d;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x813d;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x8e42;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x8e42;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x8e43;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x8e43;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x8e44;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x8e44;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    local_1c = 0x8e45;
    iVar1._M_current =
         (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar1,&local_1c);
    }
    else {
      *iVar1._M_current = 0x8e45;
      (this->m_pnames_list).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Texture border clamp functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp"
             ,0x5b);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBorderClampSamplerParameterIWithWrongPnameTest::initTest(void)
{
	/* Check if EXT_texture_border_clamp is supported */
	if (!m_is_texture_border_clamp_supported)
	{
		throw tcu::NotSupportedError(TEXTURE_BORDER_CLAMP_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate a sampler object */
	gl.genSamplers(1, &m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error generating sampler object");

	/* Bind the sampler object to a texture unit */
	gl.bindSampler(m_texture_unit_index, m_sampler_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error binding sampler object");

	/* Store all enums that should generate GL_INVALID_ENUM error when used
	 * as parameter names for glGetSamplerParameterI*() and glSamplerParameterI*()
	 * calls.
	 */
	m_pnames_list.push_back(GL_TEXTURE_BASE_LEVEL);
	m_pnames_list.push_back(GL_TEXTURE_IMMUTABLE_FORMAT);
	m_pnames_list.push_back(GL_TEXTURE_MAX_LEVEL);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_R);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_G);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_B);
	m_pnames_list.push_back(GL_TEXTURE_SWIZZLE_A);
}